

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O0

Am_Input_Char
create_input_char_from_code(short code,uint state,Am_Button_Down down,Am_Click_Count mouse)

{
  bool local_1d;
  bool meta;
  bool ctrl;
  bool shft;
  Am_Click_Count mouse_local;
  Am_Button_Down down_local;
  uint state_local;
  short code_local;
  Am_Input_Char ic;
  
  local_1d = (state & 1) != 0;
  if ((((state & 2) != 0) && (0x60 < code)) && (code < 0x7b)) {
    local_1d = true;
  }
  Am_Input_Char::Am_Input_Char
            ((Am_Input_Char *)&state_local,code,local_1d,(state & 4) != 0,(state & 8) != 0,down,
             mouse,false);
  return (Am_Input_Char)state_local;
}

Assistant:

Am_Input_Char
create_input_char_from_code(short code, unsigned int state, Am_Button_Down down,
                            Am_Click_Count mouse)
{

  bool shft = false;
  bool ctrl = false;
  bool meta = false;

  if ((state & ShiftMask))
    shft = true;

  //only use shift lock for alphabetic characters
  if ((state & LockMask) && (code >= 'a') && (code <= 'z'))
    shft = true;

  if (state & ControlMask)
    ctrl = true;
  if (state & Mod1Mask)
    meta = true;

  Am_Input_Char ic = Am_Input_Char(code, shft, ctrl, meta, down, mouse);

  return ic;
}